

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BARef::define(BARef *this,Box *bx)

{
  value_type *in_RDI;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *unaff_retaddr;
  
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void
BARef::define (const Box& bx)
{
    BL_ASSERT(m_abox.size() == 0);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(-1);
#endif
    m_abox.push_back(bx);
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}